

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O1

Float __thiscall
pbrt::TrowbridgeReitzDistribution::PDF(TrowbridgeReitzDistribution *this,Vector3f wo,Vector3f wm)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  Float FVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dd;
  undefined1 auVar13 [16];
  float __x;
  undefined1 auVar14 [16];
  float fVar15;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  float local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_28 = wm.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._8_56_ = wm._8_56_;
  auVar12._0_8_ = wm.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_58.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._8_56_ = wo._8_56_;
  auVar11._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_58._0_8_ = vmovlps_avx(auVar11._0_16_);
  uStack_20 = 0;
  fVar1 = local_28 * local_28;
  fVar15 = 0.0;
  auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT816(0) << 0x40);
  __x = auVar14._0_4_;
  local_38 = auVar12._0_16_;
  local_48 = vmovshdup_avx(local_38);
  uStack_24 = in_XMM3_Db;
  uStack_1c = in_XMM3_Dd;
  if ((ABS(__x / fVar1) != INFINITY) && (1e-16 <= fVar1 * fVar1)) {
    if (__x < 0.0) {
      fVar15 = sqrtf(__x);
      auVar14 = ZEXT416((uint)__x);
    }
    else {
      auVar10 = vsqrtss_avx(auVar14,auVar14);
      fVar15 = auVar10._0_4_;
    }
    fVar5 = 1.0;
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      auVar9._0_4_ = local_38._0_4_ / fVar15;
      auVar9._4_12_ = local_38._4_12_;
      auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
      uVar2 = vcmpss_avx512f(auVar9,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar5 = (float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar10._0_4_);
    }
    fVar15 = this->alpha_x;
    if (auVar14._0_4_ < 0.0) {
      fVar7 = sqrtf(auVar14._0_4_);
    }
    else {
      auVar14 = vsqrtss_avx(auVar14,auVar14);
      fVar7 = auVar14._0_4_;
    }
    fVar6 = 0.0;
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      auVar10._0_4_ = local_48._0_4_ / fVar7;
      auVar10._4_12_ = local_48._4_12_;
      auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar10);
      uVar2 = vcmpss_avx512f(auVar10,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar6 = (float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar14._0_4_);
    }
    fVar7 = this->alpha_y;
    fVar15 = ((fVar5 * fVar5) / (fVar15 * fVar15) + (fVar6 * fVar6) / (fVar7 * fVar7)) *
             (__x / fVar1) + 1.0;
    fVar15 = 1.0 / (fVar7 * this->alpha_x * 3.1415927 * fVar1 * fVar1 * fVar15 * fVar15);
  }
  FVar8 = Lambda(this,(Vector3f *)&local_58);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)local_48._0_4_ * local_58.y)),local_38,
                            ZEXT416((uint)local_58.x));
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar4._4_4_ = uStack_24;
  auVar4._0_4_ = local_28;
  auVar4._8_4_ = uStack_20;
  auVar4._12_4_ = uStack_1c;
  auVar14 = vfmadd213ss_fma(auVar4,ZEXT416((uint)local_58.z),auVar14);
  auVar14 = vandps_avx(auVar14,auVar13);
  auVar10 = vandps_avx(ZEXT416((uint)local_58.z),auVar13);
  return ((1.0 / (FVar8 + 1.0)) * fVar15 * auVar14._0_4_) / auVar10._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wm) const {
        return D(wm) * G1(wo) * AbsDot(wo, wm) / AbsCosTheta(wo);
    }